

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::SetForcedPackagePrefix(objectivec *this,string_view prefix)

{
  long lVar1;
  long *local_38 [2];
  long local_28 [2];
  
  lVar1 = (anonymous_namespace)::g_prefix_mode;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,prefix._M_len,this + prefix._M_len);
  std::__cxx11::string::operator=((string *)(lVar1 + 0x68),(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void SetForcedPackagePrefix(absl::string_view prefix) {
  g_prefix_mode.set_forced_package_prefix(prefix);
}